

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demand_queue.hpp
# Opt level: O3

void __thiscall
so_5::disp::prio_one_thread::quoted_round_robin::impl::demand_queue_t::stop(demand_queue_t *this)

{
  _Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false> _Var1;
  
  _Var1._M_head_impl =
       (this->m_lock)._M_t.
       super___uniq_ptr_impl<so_5::disp::mpsc_queue_traits::lock_t,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
       ._M_t.
       super__Tuple_impl<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_std::default_delete<so_5::disp::mpsc_queue_traits::lock_t>_>
       .super__Head_base<0UL,_so_5::disp::mpsc_queue_traits::lock_t_*,_false>._M_head_impl;
  (*(_Var1._M_head_impl)->_vptr_lock_t[2])(_Var1._M_head_impl);
  this->m_shutdown = true;
  if (this->m_total_demands_count == 0) {
    (*(_Var1._M_head_impl)->_vptr_lock_t[5])(_Var1._M_head_impl);
  }
  (*(_Var1._M_head_impl)->_vptr_lock_t[3])(_Var1._M_head_impl);
  return;
}

Assistant:

void
		stop()
			{
				queue_traits::lock_guard_t lock{ *m_lock };

				m_shutdown = true;

				if( !m_total_demands_count )
					// There could be a sleeping working thread.
					// It must be notified.
					lock.notify_one();
			}